

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O0

int __thiscall
adios2::Remote::LaunchRemoteServerViaConnectionManager(Remote *this,string *remoteHost)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  pointer ppVar5;
  char *value;
  char *key;
  string cookie;
  int serverPort;
  char *rest;
  char *token;
  char response [2048];
  string request;
  HostConfig *ho;
  iterator __end2;
  iterator __begin2;
  vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> *__range2;
  iterator it;
  HostConfig *hostconf;
  NetworkSocket socket;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
  *in_stack_fffffffffffff388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3d0;
  string *in_stack_fffffffffffff3d8;
  string *in_stack_fffffffffffff3e0;
  string *in_stack_fffffffffffff3e8;
  string *in_stack_fffffffffffff3f0;
  undefined1 local_bc1 [33];
  string local_ba0 [39];
  allocator local_b79;
  string local_b78 [39];
  allocator local_b51;
  string local_b50 [39];
  allocator local_b29;
  string local_b28 [39];
  allocator local_b01;
  string local_b00 [32];
  string local_ae0 [24];
  size_t in_stack_fffffffffffff538;
  char *in_stack_fffffffffffff540;
  string *in_stack_fffffffffffff548;
  NetworkSocket *in_stack_fffffffffffff550;
  undefined1 local_a91 [40];
  undefined1 local_a69 [40];
  undefined1 local_a41 [33];
  string *local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a18;
  string local_a10 [36];
  int local_9ec;
  char *local_9e8;
  string *local_9e0;
  char local_9d8 [112];
  string *in_stack_fffffffffffff698;
  uint16_t in_stack_fffffffffffff6a6;
  string *in_stack_fffffffffffff6a8;
  NetworkSocket *in_stack_fffffffffffff6b0;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [39];
  undefined1 local_129 [40];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  reference local_b8;
  HostConfig *local_b0;
  __normal_iterator<adios2::HostConfig_*,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>
  local_a8;
  vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> *local_a0;
  _Self local_98;
  _Self local_90;
  reference local_88;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [60];
  int local_4;
  
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) != 0) ||
     (bVar2 = std::operator==(in_stack_fffffffffffff390,(char *)in_stack_fffffffffffff388), bVar2))
  {
    local_4 = 0x6658;
  }
  else {
    helper::NetworkSocket::NetworkSocket((NetworkSocket *)in_stack_fffffffffffff390);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"localhost",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"tcp",&local_79);
    helper::NetworkSocket::Connect
              (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a6,
               in_stack_fffffffffffff698);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_88 = (reference)0x0;
    std::
    __shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0xd49c9d);
    local_90._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
         ::find(in_stack_fffffffffffff388,(key_type *)0xd49cad);
    std::
    __shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0xd49cd8);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
         ::end(in_stack_fffffffffffff388);
    bVar2 = std::operator!=(&local_90,&local_98);
    if (bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>
                             *)0xd49d13);
      local_a0 = &ppVar5->second;
      local_a8._M_current =
           (HostConfig *)
           std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::begin
                     ((vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> *)
                      in_stack_fffffffffffff388);
      local_b0 = (HostConfig *)
                 std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::end
                           ((vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> *)
                            in_stack_fffffffffffff388);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<adios2::HostConfig_*,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>
                                 *)in_stack_fffffffffffff390,
                                (__normal_iterator<adios2::HostConfig_*,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>
                                 *)in_stack_fffffffffffff388), bVar2) {
        local_b8 = __gnu_cxx::
                   __normal_iterator<adios2::HostConfig_*,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>
                   ::operator*(&local_a8);
        if (local_b8->protocol == SSH) {
          local_88 = local_b8;
        }
        __gnu_cxx::
        __normal_iterator<adios2::HostConfig_*,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>
        ::operator++(&local_a8);
      }
    }
    if (local_88 == (reference)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"Toolkit",&local_d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"Remote",&local_101);
      in_stack_fffffffffffff3f0 = (string *)local_129;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_129 + 1),"EstablishConnection",
                 (allocator *)in_stack_fffffffffffff3f0);
      std::operator+((char *)in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      std::operator+(in_stack_fffffffffffff398,(char *)in_stack_fffffffffffff390);
      helper::Throw<std::invalid_argument>
                (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0,
                 in_stack_fffffffffffff3d8,(int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string((string *)(local_129 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_129);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    std::operator+((char *)in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
    std::operator+(in_stack_fffffffffffff398,(char *)in_stack_fffffffffffff390);
    std::operator+(in_stack_fffffffffffff398,in_stack_fffffffffffff390);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string(local_1d0);
    helper::NetworkSocket::RequestResponse
              (in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540,
               in_stack_fffffffffffff538);
    local_9e8 = local_9d8;
    local_9ec = -1;
    std::__cxx11::string::string(local_a10);
    while (local_9e0 = (string *)strtok_r(local_9e8,",",&local_9e8), local_9e0 != (string *)0x0) {
      local_a20 = local_9e0;
      local_a18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  strtok_r((char *)local_9e0,":",(char **)&local_a20);
      iVar3 = strncmp((char *)local_a18,"port",4);
      if (iVar3 == 0) {
        local_9ec = atoi((char *)local_a20);
      }
      else {
        iVar3 = strncmp((char *)local_a18,"cookie",6);
        if (iVar3 == 0) {
          in_stack_fffffffffffff3e8 = (string *)local_a41;
          in_stack_fffffffffffff3e0 = local_a20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_a41 + 1),(char *)in_stack_fffffffffffff3e0,
                     (allocator *)in_stack_fffffffffffff3e8);
          std::__cxx11::string::operator=(local_a10,(string *)(local_a41 + 1));
          std::__cxx11::string::~string((string *)(local_a41 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_a41);
        }
        else {
          iVar3 = strncmp((char *)local_a18,"msg",3);
          if (iVar3 == 0) {
            iVar3 = strcmp((char *)local_a20,"no_error");
            if (iVar3 != 0) {
              in_stack_fffffffffffff3d8 = (string *)local_a69;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_a69 + 1),"Toolkit",(allocator *)in_stack_fffffffffffff3d8)
              ;
              in_stack_fffffffffffff3d0 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a91;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_a91 + 1),"Remote",(allocator *)in_stack_fffffffffffff3d0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&stack0xfffffffffffff548,"EstablishConnection",
                         (allocator *)&stack0xfffffffffffff547);
              psVar1 = local_a20;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_b00,(char *)psVar1,&local_b01);
              std::operator+((char *)in_stack_fffffffffffff398,in_stack_fffffffffffff390);
              helper::Throw<std::invalid_argument>
                        (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                         in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                         (int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
              std::__cxx11::string::~string(local_ae0);
              std::__cxx11::string::~string(local_b00);
              std::allocator<char>::~allocator((allocator<char> *)&local_b01);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffff548);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff547);
              std::__cxx11::string::~string((string *)(local_a91 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_a91);
              std::__cxx11::string::~string((string *)(local_a69 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_a69);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b28,"Toolkit",&local_b29);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b50,"Remote",&local_b51);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b78,"EstablishConnection",&local_b79);
            in_stack_fffffffffffff398 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc1;
            in_stack_fffffffffffff390 = local_a18;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_bc1 + 1),(char *)in_stack_fffffffffffff390,
                       (allocator *)in_stack_fffffffffffff398);
            std::operator+((char *)in_stack_fffffffffffff398,in_stack_fffffffffffff390);
            helper::Throw<std::invalid_argument>
                      (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0
                       ,in_stack_fffffffffffff3d8,(int)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
            std::__cxx11::string::~string(local_ba0);
            std::__cxx11::string::~string((string *)(local_bc1 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_bc1);
            std::__cxx11::string::~string(local_b78);
            std::allocator<char>::~allocator((allocator<char> *)&local_b79);
            std::__cxx11::string::~string(local_b50);
            std::allocator<char>::~allocator((allocator<char> *)&local_b51);
            std::__cxx11::string::~string(local_b28);
            std::allocator<char>::~allocator((allocator<char> *)&local_b29);
          }
        }
      }
    }
    helper::NetworkSocket::Close((NetworkSocket *)in_stack_fffffffffffff390);
    local_4 = local_9ec;
    std::__cxx11::string::~string(local_a10);
    std::__cxx11::string::~string(local_190);
    helper::NetworkSocket::~NetworkSocket((NetworkSocket *)in_stack_fffffffffffff390);
  }
  return local_4;
}

Assistant:

int Remote::LaunchRemoteServerViaConnectionManager(const std::string remoteHost)
{
    if (remoteHost.empty() || remoteHost == "localhost")
    {
        // std::cout << "Remote::LaunchRemoteServerViaConnectionManager: Assume server is already "
        //              "running at on localhost at port = "
        //           << 26200 << std::endl;
        return 26200;
    }

    helper::NetworkSocket socket;
    socket.Connect("localhost", 30000);

    struct adios2::HostConfig *hostconf = nullptr;

    auto it = m_HostOptions->find(remoteHost);
    if (it != m_HostOptions->end())
    {
        for (auto &ho : it->second)
        {
            if (ho.protocol == HostAccessProtocol::SSH)
            {
                hostconf = &ho;
            }
        }
    }
    if (!hostconf)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "Remote", "EstablishConnection",
                                             "No ssh configuration found for host " + remoteHost +
                                                 ". Add config in ~/.config/adios2/hosts.yaml");
    }

    std::string request = "/run_service?group=" + remoteHost + "&service=" + hostconf->name;

    char response[2048];
    socket.RequestResponse(request, response, 2048);

    // responses:
    //   port:-1,msg:incomplete_service_definition
    //   port:-1,msg:missing_service_in_request
    //   port:26200,cookie:0xd93d91e3643c9869,msg:no_error

    char *token;
    char *rest = response;

    int serverPort = -1;
    std::string cookie;

    // std::cout << "Response = \"" << response << "\"" << std::endl;
    while ((token = strtok_r(rest, ",", &rest)))
    {
        char *key;
        char *value = token;
        key = strtok_r(value, ":", &value);
        if (!strncmp(key, "port", 4))
        {
            serverPort = atoi(value);
        }
        else if (!strncmp(key, "cookie", 6))
        {
            cookie = std::string(value);
        }
        else if (!strncmp(key, "msg", 3))
        {
            if (strcmp(value, "no_error"))
            {
                helper::Throw<std::invalid_argument>("Toolkit", "Remote", "EstablishConnection",
                                                     "Error response from connection manager: " +
                                                         std::string(value));
            }
        }
        else
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "Remote", "EstablishConnection",
                "Invalid response from connection manager. Do not understand key " +
                    std::string(key));
        }
    }

    socket.Close();
    return serverPort;
}